

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O0

pair<client_message,_bool> *
client_message::from(pair<client_message,_bool> *__return_storage_ptr__,char *stream,size_t len)

{
  bool bVar1;
  int iVar2;
  unsigned_long *puVar3;
  bool local_1a2;
  bool local_1a1;
  client_message local_1a0;
  ulong local_150;
  size_t i;
  unsigned_long local_140;
  ulong local_138;
  size_t name_len;
  client_message local_128;
  uint8_t *local_d8;
  uint8_t *pointer;
  uint8_t *data;
  client_message msg;
  client_message local_70;
  undefined4 local_1c;
  size_t sStack_18;
  int MIN_MESSAGE_LEN;
  size_t len_local;
  char *stream_local;
  
  local_1c = 0xe;
  sStack_18 = len;
  len_local = (size_t)stream;
  if (len < 0xf) {
    memset(&local_70,0,0x50);
    client_message(&local_70);
    msg.player_name[0x3f] = '\0';
    std::make_pair<client_message,bool>
              (__return_storage_ptr__,&local_70,(bool *)(msg.player_name + 0x3f));
  }
  else {
    client_message((client_message *)&data);
    pointer = (uint8_t *)len_local;
    local_d8 = (uint8_t *)len_local;
    anon_unknown.dwarf_2d163::consume_bytes<unsigned_long>
              ((uint8_t *)len_local,sStack_18,&local_d8,(unsigned_long *)&data);
    anon_unknown.dwarf_2d163::consume_bytes<signed_char>(pointer,sStack_18,&local_d8,(char *)&msg);
    anon_unknown.dwarf_2d163::consume_bytes<unsigned_int>
              (pointer,sStack_18,&local_d8,(uint *)((long)&msg.session_id + 4));
    iVar2 = (int)(char)msg.session_id;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if (iVar2 < 2) {
      local_140 = sStack_18 - 0xd;
      i = 0x40;
      puVar3 = std::min<unsigned_long>(&local_140,&i);
      local_138 = *puVar3;
      for (local_150 = 0;
          (local_150 < local_138 &&
          (msg.player_name[local_150 - 8] = local_d8[local_150], local_d8[local_150] != '\0'));
          local_150 = local_150 + 1) {
      }
      bVar1 = util::is_valid_player_name(&msg.turn_direction,local_138,true);
      if (bVar1) {
        local_1a2 = true;
        std::make_pair<client_message&,bool>
                  (__return_storage_ptr__,(client_message *)&data,&local_1a2);
      }
      else {
        memset(&local_1a0,0,0x50);
        client_message(&local_1a0);
        local_1a1 = false;
        std::make_pair<client_message,bool>(__return_storage_ptr__,&local_1a0,&local_1a1);
      }
    }
    else {
      memset(&local_128,0,0x50);
      client_message(&local_128);
      name_len._7_1_ = 0;
      std::make_pair<client_message,bool>
                (__return_storage_ptr__,&local_128,(bool *)((long)&name_len + 7));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<client_message, bool> client_message::from(const char* stream, size_t len)
{
	constexpr int MIN_MESSAGE_LEN = sizeof(client_message::session_id)
		+ sizeof(client_message::turn_direction)
		+ sizeof(client_message::next_expected_event) + sizeof('\0');

	if (len <= MIN_MESSAGE_LEN)
		return std::make_pair(client_message(), false);

	client_message msg;

	const uint8_t* data = reinterpret_cast<const std::uint8_t*>(stream);
	const uint8_t* pointer = data;
	consume_bytes(data, len, pointer, msg.session_id);
	consume_bytes(data, len, pointer, msg.turn_direction);
	consume_bytes(data, len, pointer, msg.next_expected_event);

	// Only { -1, 0, 1 } are valid turn_directions
	if (std::abs(msg.turn_direction) > 1)
		return std::make_pair(client_message(), false);

	const size_t name_len = std::min(len - MIN_MESSAGE_LEN + 1, sizeof(msg.player_name));
	for (size_t i = 0; i < name_len; ++i)
	{
		msg.player_name[i] = pointer[i];
		if (pointer[i] == '\0')
			break;
	}

	if (!util::is_valid_player_name(msg.player_name, name_len))
		return std::make_pair(client_message(), false);

	return std::make_pair(msg, true);
}